

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::Ogre::Bone::ConvertToAssimpNode(Bone *this,Skeleton *skeleton,aiNode *parentNode)

{
  undefined1 auVar1 [16];
  bool bVar2;
  aiNode *paVar3;
  size_type sVar4;
  ulong uVar5;
  aiNode **ppaVar6;
  reference pvVar7;
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar8;
  basic_formatter *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_70;
  Bone *local_50;
  Bone *child;
  size_t len;
  size_t i;
  aiNode *local_28;
  aiNode *node;
  aiNode *parentNode_local;
  Skeleton *skeleton_local;
  Bone *this_local;
  
  node = parentNode;
  parentNode_local = (aiNode *)skeleton;
  skeleton_local = (Skeleton *)this;
  paVar3 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar3,&this->name);
  paVar3->mParent = node;
  local_28 = paVar3;
  memcpy(&paVar3->mTransformation,&this->defaultPose,0x40);
  bVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty(&this->children);
  if (!bVar2) {
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->children);
    local_28->mNumChildren = (uint)sVar4;
    auVar1 = ZEXT416(local_28->mNumChildren) * ZEXT816(8);
    uVar5 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppaVar6 = (aiNode **)operator_new__(uVar5);
    local_28->mChildren = ppaVar6;
    len = 0;
    child = (Bone *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                              (&this->children);
    for (; paVar3 = parentNode_local, len < child; len = len + 1) {
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->children,len);
      local_50 = Skeleton::BoneById((Skeleton *)paVar3,*pvVar7);
      if (local_50 == (Bone *)0x0) {
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_1e8);
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_1e8,
                            (char (*) [48])"ConvertToAssimpNode: Failed to find child bone ");
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&this->children,len);
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar8,pvVar7);
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar8,(char (*) [13])" for parent ");
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar8,&this->id);
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar8,(char (*) [2])0xb74d44);
        this_01 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<(pbVar8,&this->name);
        Formatter::basic_formatter::operator_cast_to_string(&local_70,this_01);
        DeadlyImportError::DeadlyImportError(this_00,&local_70);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      paVar3 = ConvertToAssimpNode(local_50,(Skeleton *)parentNode_local,local_28);
      local_28->mChildren[len] = paVar3;
    }
  }
  return local_28;
}

Assistant:

aiNode *Bone::ConvertToAssimpNode(Skeleton *skeleton, aiNode *parentNode)
{
    // Bone node
    aiNode* node = new aiNode(name);
    node->mParent = parentNode;
    node->mTransformation = defaultPose;

    // Children
    if (!children.empty())
    {
        node->mNumChildren = static_cast<unsigned int>(children.size());
        node->mChildren = new aiNode*[node->mNumChildren];

        for(size_t i=0, len=children.size(); i<len; ++i)
        {
            Bone *child = skeleton->BoneById(children[i]);
            if (!child) {
                throw DeadlyImportError(Formatter::format() << "ConvertToAssimpNode: Failed to find child bone " << children[i] << " for parent " << id << " " << name);
            }
            node->mChildren[i] = child->ConvertToAssimpNode(skeleton, node);
        }
    }
    return node;
}